

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>
anon_unknown.dwarf_26820::read_dic(string *dic_name)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *this;
  string *in_RSI;
  __uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true> in_RDI;
  ifstream ifs;
  string dic_type;
  char *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  unique_ptr<ddd::DictionaryMLT<false,_false>,_std::default_delete<ddd::DictionaryMLT<false,_false>_>_>
  *in_stack_fffffffffffffd28;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  long local_248 [67];
  string local_30 [48];
  
  std::__cxx11::string::find_last_of((char *)in_RSI,0x18a435);
  std::__cxx11::string::substr((ulong)local_30,(ulong)in_RSI);
  poVar3 = std::operator<<((ostream *)&std::cout,"read dic from ");
  poVar3 = std::operator<<(poVar3,in_RSI);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_248,in_RSI,8);
  bVar1 = std::ios::operator!((ios *)((long)local_248 + *(long *)(local_248[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    bVar2 = std::operator==(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    if (bVar2) {
      ddd::make_unique<ddd::DictionarySGL<false,false>,std::ifstream&>
                ((basic_ifstream<char,_std::char_traits<char>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffd38));
      std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
      unique_ptr<ddd::DictionarySGL<false,false>,std::default_delete<ddd::DictionarySGL<false,false>>,void>
                (in_stack_fffffffffffffd30,
                 (unique_ptr<ddd::DictionarySGL<false,_false>,_std::default_delete<ddd::DictionarySGL<false,_false>_>_>
                  *)in_stack_fffffffffffffd28);
      std::
      unique_ptr<ddd::DictionarySGL<false,_false>,_std::default_delete<ddd::DictionarySGL<false,_false>_>_>
      ::~unique_ptr((unique_ptr<ddd::DictionarySGL<false,_false>,_std::default_delete<ddd::DictionarySGL<false,_false>_>_>
                     *)in_stack_fffffffffffffd20);
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      if (bVar2) {
        ddd::make_unique<ddd::DictionarySGL<false,true>,std::ifstream&>
                  ((basic_ifstream<char,_std::char_traits<char>_> *)
                   CONCAT17(bVar1,in_stack_fffffffffffffd38));
        std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
        unique_ptr<ddd::DictionarySGL<false,true>,std::default_delete<ddd::DictionarySGL<false,true>>,void>
                  (in_stack_fffffffffffffd30,
                   (unique_ptr<ddd::DictionarySGL<false,_true>,_std::default_delete<ddd::DictionarySGL<false,_true>_>_>
                    *)in_stack_fffffffffffffd28);
        std::
        unique_ptr<ddd::DictionarySGL<false,_true>,_std::default_delete<ddd::DictionarySGL<false,_true>_>_>
        ::~unique_ptr((unique_ptr<ddd::DictionarySGL<false,_true>,_std::default_delete<ddd::DictionarySGL<false,_true>_>_>
                       *)in_stack_fffffffffffffd20);
      }
      else {
        bVar2 = std::operator==(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        if (bVar2) {
          ddd::make_unique<ddd::DictionarySGL<true,false>,std::ifstream&>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)
                     CONCAT17(bVar1,in_stack_fffffffffffffd38));
          std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
          unique_ptr<ddd::DictionarySGL<true,false>,std::default_delete<ddd::DictionarySGL<true,false>>,void>
                    (in_stack_fffffffffffffd30,
                     (unique_ptr<ddd::DictionarySGL<true,_false>,_std::default_delete<ddd::DictionarySGL<true,_false>_>_>
                      *)in_stack_fffffffffffffd28);
          std::
          unique_ptr<ddd::DictionarySGL<true,_false>,_std::default_delete<ddd::DictionarySGL<true,_false>_>_>
          ::~unique_ptr((unique_ptr<ddd::DictionarySGL<true,_false>,_std::default_delete<ddd::DictionarySGL<true,_false>_>_>
                         *)in_stack_fffffffffffffd20);
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
          if (bVar2) {
            ddd::make_unique<ddd::DictionarySGL<true,true>,std::ifstream&>
                      ((basic_ifstream<char,_std::char_traits<char>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffffd38));
            std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
            unique_ptr<ddd::DictionarySGL<true,true>,std::default_delete<ddd::DictionarySGL<true,true>>,void>
                      (in_stack_fffffffffffffd30,
                       (unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                        *)in_stack_fffffffffffffd28);
            std::
            unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
            ::~unique_ptr((unique_ptr<ddd::DictionarySGL<true,_true>,_std::default_delete<ddd::DictionarySGL<true,_true>_>_>
                           *)in_stack_fffffffffffffd20);
          }
          else {
            bVar2 = std::operator==(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
            if (bVar2) {
              ddd::make_unique<ddd::DictionaryMLT<false,false>,std::ifstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)
                         CONCAT17(bVar1,in_stack_fffffffffffffd38));
              std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
              unique_ptr<ddd::DictionaryMLT<false,false>,std::default_delete<ddd::DictionaryMLT<false,false>>,void>
                        (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
              std::
              unique_ptr<ddd::DictionaryMLT<false,_false>,_std::default_delete<ddd::DictionaryMLT<false,_false>_>_>
              ::~unique_ptr((unique_ptr<ddd::DictionaryMLT<false,_false>,_std::default_delete<ddd::DictionaryMLT<false,_false>_>_>
                             *)in_stack_fffffffffffffd20);
            }
            else {
              bVar2 = std::operator==(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
              if (bVar2) {
                ddd::make_unique<ddd::DictionaryMLT<false,true>,std::ifstream&>
                          ((basic_ifstream<char,_std::char_traits<char>_> *)
                           CONCAT17(bVar1,in_stack_fffffffffffffd38));
                std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
                unique_ptr<ddd::DictionaryMLT<false,true>,std::default_delete<ddd::DictionaryMLT<false,true>>,void>
                          (in_stack_fffffffffffffd30,
                           (unique_ptr<ddd::DictionaryMLT<false,_true>,_std::default_delete<ddd::DictionaryMLT<false,_true>_>_>
                            *)in_stack_fffffffffffffd28);
                std::
                unique_ptr<ddd::DictionaryMLT<false,_true>,_std::default_delete<ddd::DictionaryMLT<false,_true>_>_>
                ::~unique_ptr((unique_ptr<ddd::DictionaryMLT<false,_true>,_std::default_delete<ddd::DictionaryMLT<false,_true>_>_>
                               *)in_stack_fffffffffffffd20);
              }
              else {
                bVar2 = std::operator==(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
                if (bVar2) {
                  ddd::make_unique<ddd::DictionaryMLT<true,false>,std::ifstream&>
                            ((basic_ifstream<char,_std::char_traits<char>_> *)
                             CONCAT17(bVar1,in_stack_fffffffffffffd38));
                  std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
                  unique_ptr<ddd::DictionaryMLT<true,false>,std::default_delete<ddd::DictionaryMLT<true,false>>,void>
                            (in_stack_fffffffffffffd30,
                             (unique_ptr<ddd::DictionaryMLT<true,_false>,_std::default_delete<ddd::DictionaryMLT<true,_false>_>_>
                              *)in_stack_fffffffffffffd28);
                  std::
                  unique_ptr<ddd::DictionaryMLT<true,_false>,_std::default_delete<ddd::DictionaryMLT<true,_false>_>_>
                  ::~unique_ptr((unique_ptr<ddd::DictionaryMLT<true,_false>,_std::default_delete<ddd::DictionaryMLT<true,_false>_>_>
                                 *)in_stack_fffffffffffffd20);
                }
                else {
                  bVar2 = std::operator==(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
                  if (bVar2) {
                    ddd::make_unique<ddd::DictionaryMLT<true,true>,std::ifstream&>
                              ((basic_ifstream<char,_std::char_traits<char>_> *)
                               CONCAT17(bVar1,in_stack_fffffffffffffd38));
                    std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
                    unique_ptr<ddd::DictionaryMLT<true,true>,std::default_delete<ddd::DictionaryMLT<true,true>>,void>
                              (in_stack_fffffffffffffd30,
                               (unique_ptr<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                                *)in_stack_fffffffffffffd28);
                    std::
                    unique_ptr<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                    ::~unique_ptr((unique_ptr<ddd::DictionaryMLT<true,_true>,_std::default_delete<ddd::DictionaryMLT<true,_true>_>_>
                                   *)in_stack_fffffffffffffd20);
                  }
                  else {
                    poVar3 = std::operator<<((ostream *)&std::cerr,"invalid extension ");
                    this = std::operator<<(poVar3,local_30);
                    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
                    std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
                    unique_ptr<std::default_delete<ddd::Dictionary>,void>
                              ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *
                               )poVar3,this);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"failed to open ");
    poVar3 = std::operator<<(poVar3,in_RSI);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::unique_ptr<ddd::Dictionary,std::default_delete<ddd::Dictionary>>::
    unique_ptr<std::default_delete<ddd::Dictionary>,void>
              ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
               in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  }
  std::ifstream::~ifstream(local_248);
  std::__cxx11::string::~string(local_30);
  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)
         (tuple<ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)
         in_RDI.super___uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>._M_t.
         super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>.
         super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Dictionary> read_dic(const std::string dic_name) {
  std::string dic_type{dic_name.substr(dic_name.find_last_of(".") + 1)};

  std::cout << "read dic from " << dic_name << std::endl;
  std::ifstream ifs{dic_name};
  if (!ifs) {
    std::cerr << "failed to open " << dic_name << std::endl;
    return nullptr;
  }

  if (dic_type == "SGL") {
    return make_unique<DictionarySGL<false, false>>(ifs);
  } else if (dic_type == "SGL_NL") {
    return make_unique<DictionarySGL<false, true>>(ifs);
  } else if (dic_type == "SGL_BL") {
    return make_unique<DictionarySGL<true, false>>(ifs);
  } else if (dic_type == "SGL_NL_BL") {
    return make_unique<DictionarySGL<true, true>>(ifs);
  } else if (dic_type == "MLT") {
    return make_unique<DictionaryMLT<false, false>>(ifs);
  } else if (dic_type == "MLT_NL") {
    return make_unique<DictionaryMLT<false, true>>(ifs);
  } else if (dic_type == "MLT_BL") {
    return make_unique<DictionaryMLT<true, false>>(ifs);
  } else if (dic_type == "MLT_NL_BL") {
    return make_unique<DictionaryMLT<true, true>>(ifs);
  }

  std::cerr << "invalid extension " << dic_type << std::endl;
  return nullptr;
}